

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# communicator.cpp
# Opt level: O3

void __thiscall GGSock::Communicator::Data::doSend(Data *this)

{
  int iVar1;
  undefined8 in_RAX;
  ssize_t sVar2;
  int *piVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  undefined8 uStack_38;
  
  iVar4 = this->rbHead;
  uVar5 = (uint)(this->ringBufferSend)._M_elems[iVar4]._M_string_length;
  if (uVar5 != 0) {
    uVar6 = 0;
    uStack_38 = in_RAX;
    do {
      sVar2 = ::send(this->sdpeer,(this->ringBufferSend)._M_elems[iVar4]._M_dataplus._M_p + uVar6,
                     (ulong)uVar5,0);
      iVar1 = (int)sVar2;
      if (iVar1 < 0) {
        piVar3 = __errno_location();
        if (*piVar3 != 0xb) {
          this->isConnected = false;
          anon_unknown.dwarf_783c::closeAndReset(&this->sdpeer);
          anon_unknown.dwarf_783c::closeAndReset(&this->sd);
          if ((this->errorCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
            uStack_38 = CONCAT26((short)*piVar3,(undefined6)uStack_38);
            (*(this->errorCallback)._M_invoker)
                      ((_Any_data *)&this->errorCallback,(short *)((long)&uStack_38 + 6));
          }
          break;
        }
      }
      else {
        uVar5 = uVar5 - iVar1;
        uVar6 = (ulong)(uint)((int)uVar6 + iVar1);
      }
    } while (uVar5 != 0);
  }
  iVar4 = 0;
  if (this->rbHead < 0x7f) {
    iVar4 = this->rbHead + 1;
  }
  this->rbHead = iVar4;
  return;
}

Assistant:

void doSend() {
            const auto & curMessage = ringBufferSend[rbHead];
            TBufferSize size = (TBufferSize) curMessage.size();

            int offset = 0;
            while (size > 0) {
                int rc = (int) ::send(sdpeer, curMessage.data() + offset, size, 0);
                if (rc < 0) {
                    if (e_wouldBlock() == false) {
                        isConnected = false;
                        ::closeAndReset(sdpeer);
                        ::closeAndReset(sd);

                        if (errorCallback) {
                            TErrorCode errorCode = errno;
                            errorCallback(errorCode);
                        }

                        break;
                    }
                    continue;
                }
                size -= rc;
                offset += rc;
            }

            if (++rbHead >= (int) ringBufferSend.size()) {
                rbHead = 0;
            }
        }